

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearch.hpp
# Opt level: O0

void __thiscall QuantLib::LineSearch::~LineSearch(LineSearch *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__LineSearch_00500c40;
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2cce4a);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2cce58);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2cce66);
  return;
}

Assistant:

virtual ~LineSearch() {}